

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O1

ssize_t lightconf::config_format::read(int __fd,void *__buf,size_t __nbytes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 in_register_0000003c;
  scanner sc;
  _Any_data _Stack_b8;
  code *local_a8;
  undefined4 local_98;
  scanner local_90;
  
  paVar1 = &local_90.input_.field_2;
  local_90.input_._M_string_length = 0;
  local_90.input_.field_2._M_local_buf[0] = '\0';
  local_90.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  local_90.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  local_90.tokens_.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_90._52_8_ = 0;
  local_90.eof_ = true;
  local_90.pos_ = 0;
  local_90.line_ = 1;
  local_90.col_ = 1;
  local_90.params_.comment_function.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_90.params_.comment_function.super__Function_base._M_functor._8_8_ = 0;
  local_90.params_.comment_function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_90.params_.comment_function._M_invoker = (_Invoker_type)0x0;
  local_90.params_.flags = 0;
  local_90.input_._M_dataplus._M_p = (pointer)paVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&_Stack_b8,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)default_scanner_params);
  local_98 = default_scanner_params._32_4_;
  scanner::scan(&local_90,(string *)__buf,(scanner_params *)&_Stack_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&_Stack_b8,&_Stack_b8,__destroy_functor);
  }
  read_group((group *)CONCAT44(in_register_0000003c,__fd),&local_90,false);
  if (local_90.params_.comment_function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_90.params_.comment_function.super__Function_base._M_manager)
              ((_Any_data *)&local_90.params_,(_Any_data *)&local_90.params_,__destroy_functor);
  }
  std::vector<lightconf::token,_std::allocator<lightconf::token>_>::~vector(&local_90.tokens_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.input_._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.input_._M_dataplus._M_p);
  }
  return (ssize_t)(group *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

inline group read(const std::string& src) {
    scanner sc;
    sc.scan(src);
    return read_group(sc, false);
}